

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O0

TxfmFuncSSE2 fwd_txfm_type_to_func(TXFM_TYPE txfm_type)

{
  TXFM_TYPE txfm_type_local;
  TxfmFuncSSE2 local_8;
  
  if (txfm_type == '\x03') {
    local_8 = fdct32_sse4_1;
  }
  else if (txfm_type == '\x04') {
    local_8 = fdct64_new_sse4_1;
  }
  else if (txfm_type == '\v') {
    local_8 = idtx32x32_sse4_1;
  }
  else {
    local_8 = (TxfmFuncSSE2)0x0;
  }
  return local_8;
}

Assistant:

static inline TxfmFuncSSE2 fwd_txfm_type_to_func(TXFM_TYPE txfm_type) {
  switch (txfm_type) {
    case TXFM_TYPE_DCT32: return fdct32_sse4_1;
    case TXFM_TYPE_DCT64: return fdct64_new_sse4_1;
    case TXFM_TYPE_IDENTITY32: return idtx32x32_sse4_1;
    default: assert(0);
  }
  return NULL;
}